

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O2

void VP8CodeIntraModes(VP8Encoder *enc)

{
  VP8BitWriter *bw;
  byte bVar1;
  byte bVar2;
  VP8MBInfo *pVVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  long lStack_f70;
  uint8_t *local_f68;
  VP8EncIterator it;
  
  bw = &enc->bw_;
  VP8IteratorInit(enc,&it);
  do {
    puVar4 = it.preds_;
    pVVar3 = it.mb_;
    local_f68 = it.preds_;
    if ((enc->segment_hdr_).update_map_ != 0) {
      bVar9 = *(byte *)it.mb_;
      iVar5 = VP8PutBit(bw,bVar9 >> 6 & 1,(uint)(enc->proba_).segments_[0]);
      VP8PutBit(bw,bVar9 >> 5 & 1,(uint)*(byte *)((long)enc + (0xe22 - (ulong)(iVar5 == 0))));
    }
    if ((enc->proba_).use_skip_proba_ != 0) {
      VP8PutBit(bw,(uint)*pVVar3 >> 4 & 1,(uint)(enc->proba_).skip_proba_);
    }
    iVar5 = VP8PutBit(bw,(uint)(((uint)*pVVar3 & 3) != 0),0x91);
    if (iVar5 == 0) {
      iVar5 = enc->preds_w_;
      for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
        bVar9 = local_f68[-1];
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          bVar1 = local_f68[lVar10 - iVar5];
          bVar2 = local_f68[lVar10];
          iVar7 = VP8PutBit(bw,(uint)(bVar2 != 0),(uint)kBModesProba[bVar1][bVar9][0]);
          if (iVar7 != 0) {
            iVar7 = VP8PutBit(bw,(uint)(bVar2 != 1),(uint)kBModesProba[bVar1][bVar9][1]);
            if (iVar7 != 0) {
              iVar7 = VP8PutBit(bw,(uint)(bVar2 != 2),(uint)kBModesProba[bVar1][bVar9][2]);
              if (iVar7 != 0) {
                iVar7 = VP8PutBit(bw,(uint)(5 < bVar2),(uint)kBModesProba[bVar1][bVar9][3]);
                if (iVar7 == 0) {
                  iVar7 = VP8PutBit(bw,(uint)(bVar2 != 3),(uint)kBModesProba[bVar1][bVar9][4]);
                  bVar8 = 4;
                  lStack_f70 = 5;
                }
                else {
                  iVar7 = VP8PutBit(bw,(uint)(bVar2 != 6),(uint)kBModesProba[bVar1][bVar9][6]);
                  if (iVar7 == 0) goto LAB_0013229b;
                  iVar7 = VP8PutBit(bw,(uint)(bVar2 != 7),(uint)kBModesProba[bVar1][bVar9][7]);
                  bVar8 = 8;
                  lStack_f70 = 8;
                }
                if (iVar7 != 0) {
                  VP8PutBit(bw,(uint)(bVar8 != bVar2),(uint)kBModesProba[bVar1][bVar9][lStack_f70]);
                }
              }
            }
          }
LAB_0013229b:
          bVar9 = bVar2;
        }
        local_f68 = local_f68 + iVar5;
      }
    }
    else {
      bVar9 = *puVar4;
      iVar6 = VP8PutBit(bw,(uint)((bVar9 & 0xfd) == 1),0x9c);
      iVar5 = 0x80;
      if (iVar6 == 0) {
        iVar5 = 0xa3;
      }
      VP8PutBit(bw,(uint)((byte)((iVar6 == 0) + 1U) == bVar9),iVar5);
    }
    bVar9 = *(byte *)pVVar3 >> 2 & 3;
    iVar5 = VP8PutBit(bw,(uint)(bVar9 != 0),0x8e);
    if (iVar5 != 0) {
      iVar5 = VP8PutBit(bw,(uint)(bVar9 != 2),0x72);
      if (iVar5 != 0) {
        VP8PutBit(bw,(uint)(bVar9 != 3),0xb7);
      }
    }
    iVar5 = VP8IteratorNext(&it);
    if (iVar5 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void VP8CodeIntraModes(VP8Encoder* const enc) {
  VP8BitWriter* const bw = &enc->bw_;
  VP8EncIterator it;
  VP8IteratorInit(enc, &it);
  do {
    const VP8MBInfo* const mb = it.mb_;
    const uint8_t* preds = it.preds_;
    if (enc->segment_hdr_.update_map_) {
      PutSegment(bw, mb->segment_, enc->proba_.segments_);
    }
    if (enc->proba_.use_skip_proba_) {
      VP8PutBit(bw, mb->skip_, enc->proba_.skip_proba_);
    }
    if (VP8PutBit(bw, (mb->type_ != 0), 145)) {  // i16x16
      PutI16Mode(bw, preds[0]);
    } else {
      const int preds_w = enc->preds_w_;
      const uint8_t* top_pred = preds - preds_w;
      int x, y;
      for (y = 0; y < 4; ++y) {
        int left = preds[-1];
        for (x = 0; x < 4; ++x) {
          const uint8_t* const probas = kBModesProba[top_pred[x]][left];
          left = PutI4Mode(bw, preds[x], probas);
        }
        top_pred = preds;
        preds += preds_w;
      }
    }
    PutUVMode(bw, mb->uv_mode_);
  } while (VP8IteratorNext(&it));
}